

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O3

void bonk_learn(t_bonk *x,t_floatarg f)

{
  int iVar1;
  t_template_conflict *ptVar2;
  int iVar3;
  
  iVar3 = (int)f;
  if (0 < iVar3) {
    ptVar2 = (t_template_conflict *)resizebytes(x->x_template,(long)x->x_ntemplate * 800,0);
    x->x_template = ptVar2;
    x->x_ntemplate = 0;
  }
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  x->x_learn = iVar1;
  x->x_learncount = 0;
  return;
}

Assistant:

static void bonk_learn(t_bonk *x, t_floatarg f)
{
    int n = f;
    if (n < 0) n = 0;
    if (n)
    {
        x->x_template = (t_template *)t_resizebytes(x->x_template,
            x->x_ntemplate * sizeof(x->x_template[0]), 0);
        x->x_ntemplate = 0;
    }
    x->x_learn = n;
    x->x_learncount = 0;
}